

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkDarRetime(Abc_Ntk_t *pNtk,int nStepsMax,int fVerbose)

{
  Vec_Int_t *__ptr;
  Aig_Man_t *p;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pAVar1;
  
  p = Abc_NtkToDar(pNtk,0,1);
  if (p == (Aig_Man_t *)0x0) {
    pAVar1 = (Abc_Ntk_t *)0x0;
  }
  else {
    __ptr = p->vFlopNums;
    if (__ptr != (Vec_Int_t *)0x0) {
      if (__ptr->pArray != (int *)0x0) {
        free(__ptr->pArray);
      }
      free(__ptr);
    }
    p->vFlopNums = (Vec_Int_t *)0x0;
    pMan = Rtm_ManRetime(p,1,nStepsMax,fVerbose);
    Aig_ManStop(p);
    pAVar1 = Abc_NtkFromDarSeqSweep(pNtk,pMan);
    Aig_ManStop(pMan);
  }
  return pAVar1;
}

Assistant:

Abc_Ntk_t * Abc_NtkDarRetime( Abc_Ntk_t * pNtk, int nStepsMax, int fVerbose )
{
    Abc_Ntk_t * pNtkAig;
    Aig_Man_t * pMan, * pTemp;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return NULL;
//    Aig_ManReduceLachesCount( pMan );
    if ( pMan->vFlopNums )
        Vec_IntFree( pMan->vFlopNums ); 
    pMan->vFlopNums = NULL;

    pMan = Rtm_ManRetime( pTemp = pMan, 1, nStepsMax, fVerbose );
    Aig_ManStop( pTemp );

//    pMan = Aig_ManReduceLaches( pMan, 1 );
//    pMan = Aig_ManConstReduce( pMan, 1, 0 );

    pNtkAig = Abc_NtkFromDarSeqSweep( pNtk, pMan );
    Aig_ManStop( pMan );
    return pNtkAig;
}